

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

ostream * operator<<(ostream *out,lexemtype *t)

{
  long lVar1;
  char *pcVar2;
  
  switch(*t) {
  case OBRA:
    pcVar2 = "Open brace";
    goto LAB_00102737;
  case CBRA:
    pcVar2 = "Close brace";
    goto LAB_0010271b;
  case OPAR:
    pcVar2 = "Open parenthesis";
    lVar1 = 0x10;
    break;
  case CPAR:
    pcVar2 = "Close parenthesis";
    lVar1 = 0x11;
    break;
  case SEMICOLON:
    pcVar2 = "Semicolon operator";
    lVar1 = 0x12;
    break;
  case INTKW:
    pcVar2 = "Int keyword";
    goto LAB_0010271b;
  case RETURNKW:
    pcVar2 = "Return keyword";
    lVar1 = 0xe;
    break;
  case IFKW:
    pcVar2 = "If keyword";
    goto LAB_00102737;
  case ELSEKW:
    pcVar2 = "Else keyword";
    lVar1 = 0xc;
    break;
  case FORKW:
    pcVar2 = "For keyword";
    goto LAB_0010271b;
  case WHILEKW:
    pcVar2 = "While keyword";
    goto LAB_00102699;
  case IDENTIFIER:
    pcVar2 = "Identifier";
    goto LAB_00102737;
  case EQUAL:
    pcVar2 = "Equal sign";
    goto LAB_00102737;
  case INTLITERAL:
    pcVar2 = "Int literal";
LAB_0010271b:
    lVar1 = 0xb;
    break;
  case LESS:
    pcVar2 = "Less sign";
    goto LAB_00102745;
  case MORE:
    pcVar2 = "More sign";
    goto LAB_00102745;
  case PLUS:
    pcVar2 = "Plus sign";
LAB_00102745:
    lVar1 = 9;
    break;
  case MINUS:
    pcVar2 = "Minus sign";
    goto LAB_00102737;
  case MULTIPLICATION:
    pcVar2 = "Multiplication sign";
    goto LAB_00102753;
  case DIVISION:
    pcVar2 = "Division sign";
LAB_00102699:
    lVar1 = 0xd;
    break;
  case LOGIC_NEG:
    pcVar2 = "Logic negation sign";
LAB_00102753:
    lVar1 = 0x13;
    break;
  default:
    goto switchD_0010264b_caseD_16;
  case COMMA:
    pcVar2 = "Comma sign";
LAB_00102737:
    lVar1 = 10;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,lVar1);
switchD_0010264b_caseD_16:
  return out;
}

Assistant:

ostream &operator<<(ostream &out, const lexemtype &t) {
    switch (t) {
        case OBRA:
            return (out << "Open brace");
        case CBRA:
            return (out << "Close brace");
        case OPAR:
            return (out << "Open parenthesis");
        case CPAR:
            return (out << "Close parenthesis");
        case SEMICOLON:
            return (out << "Semicolon operator");
        case INTKW:
            return (out << "Int keyword");
        case RETURNKW:
            return (out << "Return keyword");
        case IFKW:
            return (out << "If keyword");
        case ELSEKW:
            return (out << "Else keyword");
        case IDENTIFIER:
            return (out << "Identifier");
        case INTLITERAL:
            return (out << "Int literal");
        case null:
            break;
        case FORKW:
            return (out << "For keyword");
        case WHILEKW:
            return (out << "While keyword");
        case EQUAL:
            return (out << "Equal sign");
        case LESS:
            return (out << "Less sign");
        case MORE:
            return (out << "More sign");
        case PLUS:
            return (out << "Plus sign");
        case MINUS:
            return (out << "Minus sign");
        case MULTIPLICATION:
            return (out << "Multiplication sign");
        case DIVISION:
            return (out << "Division sign");
        case LOGIC_NEG:
            return (out << "Logic negation sign");
//        case DOUBLEKW:
//            break;
//        case CHARKW:
//            break;
//        case FLOATKW:
//            break;
        case COMMA:
            return (out << "Comma sign");
    }
    return (out);
}